

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

bool S_CheckSoundLimit(sfxinfo_t *sfx,FVector3 *pos,int near_limit,float limit_range,AActor *actor,
                      int channel)

{
  undefined4 uVar1;
  undefined4 uVar2;
  FSoundChan *chan;
  int iVar3;
  FSoundChan **ppFVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  FVector3 chanorigin;
  FVector3 local_3c;
  
  iVar3 = 0;
  ppFVar4 = &Channels;
  do {
    chan = *ppFVar4;
    if ((chan == (FSoundChan *)0x0) || (near_limit <= iVar3)) {
      return near_limit <= iVar3;
    }
    if (((chan->ChanFlags & 2) == 0) && (S_sfx.Array + (chan->SoundID).ID == sfx)) {
      if ((actor != (AActor *)0x0) &&
         ((((uint)chan->EntChannel == channel && (chan->SourceType == '\x01')) &&
          ((chan->field_12).Actor == actor)))) {
        return false;
      }
      CalcPosVel(chan,&local_3c,(FVector3 *)0x0);
      fVar5 = local_3c.X - pos->X;
      uVar1 = pos->Y;
      uVar2 = pos->Z;
      fVar6 = local_3c.Y - (float)uVar1;
      fVar7 = local_3c.Z - (float)uVar2;
      iVar3 = iVar3 + (uint)(fVar7 * fVar7 + fVar5 * fVar5 + fVar6 * fVar6 <= limit_range);
    }
    ppFVar4 = &chan->NextChan;
  } while( true );
}

Assistant:

bool S_CheckSoundLimit(sfxinfo_t *sfx, const FVector3 &pos, int near_limit, float limit_range,
	AActor *actor, int channel)
{
	FSoundChan *chan;
	int count;
	
	for (chan = Channels, count = 0; chan != NULL && count < near_limit; chan = chan->NextChan)
	{
		if (!(chan->ChanFlags & CHAN_EVICTED) && &S_sfx[chan->SoundID] == sfx)
		{
			FVector3 chanorigin;

			if (actor != NULL && chan->EntChannel == channel &&
				chan->SourceType == SOURCE_Actor && chan->Actor == actor)
			{ // We are restarting a playing sound. Always let it play.
				return false;
			}

			CalcPosVel(chan, &chanorigin, NULL);
			if ((chanorigin - pos).LengthSquared() <= limit_range)
			{
				count++;
			}
		}
	}
	return count >= near_limit;
}